

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SyntaxNode *args_3;
  ValueRangeExpressionSyntax *pVVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x40),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x48),(BumpAllocator *)__child_stack);
  pVVar1 = BumpAllocator::
           emplace<slang::syntax::ValueRangeExpressionSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,(ExpressionSyntax *)args_1,&local_50,
                      (ExpressionSyntax *)args_3,&local_60);
  return (int)pVVar1;
}

Assistant:

static SyntaxNode* clone(const ValueRangeExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ValueRangeExpressionSyntax>(
        node.openBracket.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc),
        node.closeBracket.deepClone(alloc)
    );
}